

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit_test_image_function.cpp
# Opt level: O0

bool Function_Template::form1_SetPixel(SetPixelForm1 SetPixel)

{
  byte bVar1;
  uint uVar2;
  uint uVar3;
  const_reference pvVar4;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_RDI;
  uint32_t y;
  uint32_t x;
  Image image;
  vector<unsigned_char,_std::allocator<unsigned_char>_> intensity;
  uint32_t in_stack_ffffffffffffff3c;
  uint in_stack_ffffffffffffff40;
  uint8_t in_stack_ffffffffffffff46;
  uint8_t in_stack_ffffffffffffff47;
  uint32_t in_stack_ffffffffffffff48;
  uint32_t in_stack_ffffffffffffff4c;
  ImageTemplate<unsigned_char> *in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff5c;
  uint32_t in_stack_ffffffffffffff64;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *this;
  uint8_t in_stack_ffffffffffffff87;
  uint32_t in_stack_ffffffffffffff88;
  uint32_t in_stack_ffffffffffffff8c;
  uint32_t in_stack_ffffffffffffff90;
  uint32_t in_stack_ffffffffffffff94;
  Image *in_stack_ffffffffffffff98;
  ImageTemplate<unsigned_char> local_48;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_20;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *local_8;
  
  this = &local_20;
  local_8 = in_RDI;
  Unit_Test::intensityArray(in_stack_ffffffffffffff3c);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](this,0);
  PenguinV_Image::ImageTemplate<unsigned_char>::ImageTemplate
            (in_stack_ffffffffffffff50,in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48,
             in_stack_ffffffffffffff47,in_stack_ffffffffffffff46);
  Test_Helper::uniformImage
            ((uint8_t)((ulong)this >> 0x38),(uint32_t)this,in_stack_ffffffffffffff64,
             (Image *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
  PenguinV_Image::ImageTemplate<unsigned_char>::~ImageTemplate
            ((ImageTemplate<unsigned_char> *)0x1e1342);
  PenguinV_Image::ImageTemplate<unsigned_char>::width(&local_48);
  uVar2 = Test_Helper::randomValue<unsigned_int>
                    (in_stack_ffffffffffffff40,in_stack_ffffffffffffff3c);
  PenguinV_Image::ImageTemplate<unsigned_char>::height(&local_48);
  uVar3 = Test_Helper::randomValue<unsigned_int>
                    (in_stack_ffffffffffffff40,in_stack_ffffffffffffff3c);
  pvVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](&local_20,1);
  (*(code *)local_8)(&local_48,uVar2,uVar3,*pvVar4);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](&local_20,1);
  bVar1 = Unit_Test::verifyImage
                    (in_stack_ffffffffffffff98,in_stack_ffffffffffffff94,in_stack_ffffffffffffff90,
                     in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88,in_stack_ffffffffffffff87);
  PenguinV_Image::ImageTemplate<unsigned_char>::~ImageTemplate
            ((ImageTemplate<unsigned_char> *)0x1e143f);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(local_8);
  return (bool)(bVar1 & 1);
}

Assistant:

bool form1_SetPixel(SetPixelForm1 SetPixel)
    {
        const std::vector < uint8_t > intensity = intensityArray( 2 );
        PenguinV_Image::Image image  = uniformImage( intensity[0] );
        const uint32_t x = randomValue<uint32_t>( 0, image.width() );
        const uint32_t y = randomValue<uint32_t>( 0, image.height() );

        SetPixel( image, x, y, intensity[1] );

        return verifyImage( image, x, y, 1, 1, intensity[1] );
    }